

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

int If_LibLutDelaysAreDifferent(If_LibLut_t *pLutLib)

{
  float fVar1;
  float fVar2;
  int local_20;
  float Delay;
  int k;
  int i;
  If_LibLut_t *pLutLib_local;
  
  fVar1 = pLutLib->pLutDelays[1][0];
  if (pLutLib->fVarPinDelays == 0) {
    for (Delay = 2.8026e-45; (int)Delay <= pLutLib->LutMax; Delay = (float)((int)Delay + 1)) {
      fVar2 = pLutLib->pLutDelays[(int)Delay][0];
      if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
        return 1;
      }
    }
  }
  else {
    for (Delay = 2.8026e-45; (int)Delay <= pLutLib->LutMax; Delay = (float)((int)Delay + 1)) {
      for (local_20 = 0; local_20 < (int)Delay; local_20 = local_20 + 1) {
        fVar2 = pLutLib->pLutDelays[(int)Delay][local_20];
        if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int If_LibLutDelaysAreDifferent( If_LibLut_t * pLutLib )
{
    int i, k;
    float Delay = pLutLib->pLutDelays[1][0];
    if ( pLutLib->fVarPinDelays )
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
        for ( k = 0; k < i; k++ )
            if ( pLutLib->pLutDelays[i][k] != Delay )
                return 1;
    }
    else
    {
        for ( i = 2; i <= pLutLib->LutMax; i++ )
            if ( pLutLib->pLutDelays[i][0] != Delay )
                return 1;
    }
    return 0;
}